

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLhsStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,int i,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newLhs,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *oldLhs)

{
  Status *pSVar1;
  pointer pnVar2;
  Real RVar3;
  int32_t iVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  uint *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  pointer pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  pointer pnVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  pointer pnVar17;
  long in_FS_OFFSET;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  cpp_dec_float<200U,_int,_void> local_648;
  double local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined5 uStack_550;
  undefined3 uStack_54b;
  int iStack_548;
  undefined1 uStack_544;
  undefined8 local_540;
  cpp_dec_float<200U,_int,_void> local_538;
  cpp_dec_float<200U,_int,_void> local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar18 = 0;
  pSVar1 = (this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data;
  pnVar2 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (uint *)(pnVar2 + i);
  pcVar14 = &local_538;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pcVar14->data)._M_elems[0] = *puVar11;
    puVar11 = puVar11 + 1;
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((pcVar14->data)._M_elems + 1);
  }
  local_538.exp = pnVar2[i].m_backend.exp;
  local_538.neg = pnVar2[i].m_backend.neg;
  local_538.fpclass = pnVar2[i].m_backend.fpclass;
  local_538.prec_elem = pnVar2[i].m_backend.prec_elem;
  local_540._0_4_ = cpp_dec_float_finite;
  local_540._4_4_ = 0x1c;
  local_5b8 = 0;
  uStack_5b0 = 0;
  local_5a8 = 0;
  uStack_5a0 = 0;
  local_598 = 0;
  uStack_590 = 0;
  local_588 = 0;
  uStack_580 = 0;
  local_578 = 0;
  uStack_570 = 0;
  local_568 = 0;
  uStack_560 = 0;
  local_558 = 0;
  uStack_550 = 0;
  uStack_54b = 0;
  iStack_548 = 0;
  uStack_544 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_5b8,0.0);
  switch(pSVar1[i]) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    if ((this->theRep == ROW) && ((this->theShift).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_648.fpclass = cpp_dec_float_finite;
      local_648.prec_elem = 0x1c;
      local_648.data._M_elems[0] = 0;
      local_648.data._M_elems[1] = 0;
      local_648.data._M_elems[2] = 0;
      local_648.data._M_elems[3] = 0;
      local_648.data._M_elems[4] = 0;
      local_648.data._M_elems[5] = 0;
      local_648.data._M_elems[6] = 0;
      local_648.data._M_elems[7] = 0;
      local_648.data._M_elems[8] = 0;
      local_648.data._M_elems[9] = 0;
      local_648.data._M_elems[10] = 0;
      local_648.data._M_elems[0xb] = 0;
      local_648.data._M_elems[0xc] = 0;
      local_648.data._M_elems[0xd] = 0;
      local_648.data._M_elems[0xe] = 0;
      local_648.data._M_elems[0xf] = 0;
      local_648.data._M_elems[0x10] = 0;
      local_648.data._M_elems[0x11] = 0;
      local_648.data._M_elems[0x12] = 0;
      local_648.data._M_elems[0x13] = 0;
      local_648.data._M_elems[0x14] = 0;
      local_648.data._M_elems[0x15] = 0;
      local_648.data._M_elems[0x16] = 0;
      local_648.data._M_elems[0x17] = 0;
      local_648.data._M_elems[0x18] = 0;
      local_648.data._M_elems[0x19] = 0;
      local_648.data._M_elems._104_5_ = 0;
      local_648.data._M_elems[0x1b]._1_3_ = 0;
      local_648.exp = 0;
      local_648.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_648,0.0);
      iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&(this->theShift).m_backend,&local_648);
      if (0 < iVar6) {
        pcVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
        pcVar14 = pcVar8;
        pnVar12 = &this->m_nonbasicValue;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + (ulong)bVar18 * -8 + 4);
        }
        (this->m_nonbasicValue).m_backend.exp = pcVar8->exp;
        (this->m_nonbasicValue).m_backend.neg = pcVar8->neg;
        iVar4 = pcVar8->prec_elem;
        (this->m_nonbasicValue).m_backend.fpclass = pcVar8->fpclass;
        (this->m_nonbasicValue).m_backend.prec_elem = iVar4;
        this->m_nonbasicValueUpToDate = false;
      }
    }
    SVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualRowStatus(&this->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,i);
    pSVar1[i] = SVar7;
    break;
  case P_FIXED:
    pnVar12 = newLhs;
    pnVar16 = &local_230;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = (newLhs->m_backend).exp;
    local_230.m_backend.neg = (newLhs->m_backend).neg;
    local_230.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_230.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    pcVar14 = &local_538;
    pnVar12 = &local_2b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = local_538.exp;
    local_2b0.m_backend.neg = local_538.neg;
    local_2b0.m_backend.fpclass = local_538.fpclass;
    local_2b0.m_backend.prec_elem = local_538.prec_elem;
    RVar3 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar5 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_230,&local_2b0,RVar3);
    if ((bVar5) && (pSVar1[i] = P_ON_UPPER, this->initialized == true)) {
      pnVar2 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar15 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = pnVar2 + i;
      pnVar17 = pnVar15 + i;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      pnVar15[i].m_backend.exp = pnVar2[i].m_backend.exp;
      pnVar15[i].m_backend.neg = pnVar2[i].m_backend.neg;
      iVar4 = pnVar2[i].m_backend.prec_elem;
      pnVar15[i].m_backend.fpclass = pnVar2[i].m_backend.fpclass;
      pnVar15[i].m_backend.prec_elem = iVar4;
    }
    break;
  default:
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_648.data._M_elems._0_8_ = local_648.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_648,"XCHANG03 This should never happen.","");
    *puVar9 = &PTR__SPxException_006a9ee8;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_648.data._M_elems._0_8_,
               local_648.data._M_elems._0_8_ + local_648.data._M_elems._8_8_);
    *puVar9 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_5c8 = *(double *)(in_FS_OFFSET + -8);
    uStack_5c0 = 0;
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 0x1c;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems[6] = 0;
    local_648.data._M_elems[7] = 0;
    local_648.data._M_elems[8] = 0;
    local_648.data._M_elems[9] = 0;
    local_648.data._M_elems[10] = 0;
    local_648.data._M_elems[0xb] = 0;
    local_648.data._M_elems[0xc] = 0;
    local_648.data._M_elems[0xd] = 0;
    local_648.data._M_elems[0xe] = 0;
    local_648.data._M_elems[0xf] = 0;
    local_648.data._M_elems[0x10] = 0;
    local_648.data._M_elems[0x11] = 0;
    local_648.data._M_elems[0x12] = 0;
    local_648.data._M_elems[0x13] = 0;
    local_648.data._M_elems[0x14] = 0;
    local_648.data._M_elems[0x15] = 0;
    local_648.data._M_elems[0x16] = 0;
    local_648.data._M_elems[0x17] = 0;
    local_648.data._M_elems[0x18] = 0;
    local_648.data._M_elems[0x19] = 0;
    local_648.data._M_elems._104_5_ = 0;
    local_648.data._M_elems[0x1b]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_648,-local_5c8);
    if ((((newLhs->m_backend).fpclass == cpp_dec_float_NaN) ||
        (local_648.fpclass == cpp_dec_float_NaN)) ||
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&newLhs->m_backend,&local_648), 0 < iVar6)) {
      pnVar12 = newLhs;
      pnVar16 = &local_438;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_438.m_backend.exp = (newLhs->m_backend).exp;
      local_438.m_backend.neg = (newLhs->m_backend).neg;
      local_438.m_backend.fpclass = (newLhs->m_backend).fpclass;
      local_438.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
      pcVar14 = &local_538;
      pnVar12 = &local_b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = local_538.exp;
      local_b0.m_backend.neg = local_538.neg;
      local_b0.m_backend.fpclass = local_538.fpclass;
      local_b0.m_backend.prec_elem = local_538.prec_elem;
      RVar3 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      bVar5 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_438,&local_b0,RVar3);
      if (bVar5) {
        pSVar1[i] = P_FIXED;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar2 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar2 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      local_4b8.fpclass = cpp_dec_float_finite;
      local_4b8.prec_elem = 0x1c;
      local_4b8.data._M_elems[0] = 0;
      local_4b8.data._M_elems[1] = 0;
      local_4b8.data._M_elems[2] = 0;
      local_4b8.data._M_elems[3] = 0;
      local_4b8.data._M_elems[4] = 0;
      local_4b8.data._M_elems[5] = 0;
      local_4b8.data._M_elems[6] = 0;
      local_4b8.data._M_elems[7] = 0;
      local_4b8.data._M_elems[8] = 0;
      local_4b8.data._M_elems[9] = 0;
      local_4b8.data._M_elems[10] = 0;
      local_4b8.data._M_elems[0xb] = 0;
      local_4b8.data._M_elems[0xc] = 0;
      local_4b8.data._M_elems[0xd] = 0;
      local_4b8.data._M_elems[0xe] = 0;
      local_4b8.data._M_elems[0xf] = 0;
      local_4b8.data._M_elems[0x10] = 0;
      local_4b8.data._M_elems[0x11] = 0;
      local_4b8.data._M_elems[0x12] = 0;
      local_4b8.data._M_elems[0x13] = 0;
      local_4b8.data._M_elems[0x14] = 0;
      local_4b8.data._M_elems[0x15] = 0;
      local_4b8.data._M_elems[0x16] = 0;
      local_4b8.data._M_elems[0x17] = 0;
      local_4b8.data._M_elems[0x18] = 0;
      local_4b8.data._M_elems[0x19] = 0;
      local_4b8.data._M_elems._104_5_ = 0;
      local_4b8.data._M_elems[0x1b]._1_3_ = 0;
      local_4b8.exp = 0;
      local_4b8.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_4b8,&newLhs->m_backend,&oldLhs->m_backend);
      local_648.fpclass = cpp_dec_float_finite;
      local_648.prec_elem = 0x1c;
      local_648.data._M_elems[0] = 0;
      local_648.data._M_elems[1] = 0;
      local_648.data._M_elems[2] = 0;
      local_648.data._M_elems[3] = 0;
      local_648.data._M_elems[4] = 0;
      local_648.data._M_elems[5] = 0;
      local_648.data._M_elems[6] = 0;
      local_648.data._M_elems[7] = 0;
      local_648.data._M_elems[8] = 0;
      local_648.data._M_elems[9] = 0;
      local_648.data._M_elems[10] = 0;
      local_648.data._M_elems[0xb] = 0;
      local_648.data._M_elems[0xc] = 0;
      local_648.data._M_elems[0xd] = 0;
      local_648.data._M_elems[0xe] = 0;
      local_648.data._M_elems[0xf] = 0;
      local_648.data._M_elems[0x10] = 0;
      local_648.data._M_elems[0x11] = 0;
      local_648.data._M_elems[0x12] = 0;
      local_648.data._M_elems[0x13] = 0;
      local_648.data._M_elems[0x14] = 0;
      local_648.data._M_elems[0x15] = 0;
      local_648.data._M_elems[0x16] = 0;
      local_648.data._M_elems[0x17] = 0;
      local_648.data._M_elems[0x18] = 0;
      local_648.data._M_elems[0x19] = 0;
      local_648.data._M_elems._104_5_ = 0;
      local_648.data._M_elems[0x1b]._1_3_ = 0;
      local_648.exp = 0;
      local_648.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_648,&pnVar2[i].m_backend,&local_4b8);
      pcVar14 = &local_648;
      puVar11 = (uint *)&local_5b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar11 = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        puVar11 = puVar11 + (ulong)bVar18 * -2 + 1;
      }
      iStack_548 = local_648.exp;
      uStack_544 = local_648.neg;
    }
    else {
      ::soplex::infinity::__tls_init();
      local_648.fpclass = cpp_dec_float_finite;
      local_648.prec_elem = 0x1c;
      local_648.data._M_elems[0] = 0;
      local_648.data._M_elems[1] = 0;
      local_648.data._M_elems[2] = 0;
      local_648.data._M_elems[3] = 0;
      local_648.data._M_elems[4] = 0;
      local_648.data._M_elems[5] = 0;
      local_648.data._M_elems[6] = 0;
      local_648.data._M_elems[7] = 0;
      local_648.data._M_elems[8] = 0;
      local_648.data._M_elems[9] = 0;
      local_648.data._M_elems[10] = 0;
      local_648.data._M_elems[0xb] = 0;
      local_648.data._M_elems[0xc] = 0;
      local_648.data._M_elems[0xd] = 0;
      local_648.data._M_elems[0xe] = 0;
      local_648.data._M_elems[0xf] = 0;
      local_648.data._M_elems[0x10] = 0;
      local_648.data._M_elems[0x11] = 0;
      local_648.data._M_elems[0x12] = 0;
      local_648.data._M_elems[0x13] = 0;
      local_648.data._M_elems[0x14] = 0;
      local_648.data._M_elems[0x15] = 0;
      local_648.data._M_elems[0x16] = 0;
      local_648.data._M_elems[0x17] = 0;
      local_648.data._M_elems[0x18] = 0;
      local_648.data._M_elems[0x19] = 0;
      local_648.data._M_elems._104_5_ = 0;
      local_648.data._M_elems[0x1b]._1_3_ = 0;
      local_648.exp = 0;
      local_648.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_648,local_5c8);
      if (((local_538.fpclass == cpp_dec_float_NaN) || (local_648.fpclass == cpp_dec_float_NaN)) ||
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_538,&local_648), iVar6 < 0)) {
        pSVar1[i] = P_ON_UPPER;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        local_4b8.fpclass = cpp_dec_float_finite;
        local_4b8.prec_elem = 0x1c;
        local_4b8.data._M_elems[0] = 0;
        local_4b8.data._M_elems[1] = 0;
        local_4b8.data._M_elems[2] = 0;
        local_4b8.data._M_elems[3] = 0;
        local_4b8.data._M_elems[4] = 0;
        local_4b8.data._M_elems[5] = 0;
        local_4b8.data._M_elems[6] = 0;
        local_4b8.data._M_elems[7] = 0;
        local_4b8.data._M_elems[8] = 0;
        local_4b8.data._M_elems[9] = 0;
        local_4b8.data._M_elems[10] = 0;
        local_4b8.data._M_elems[0xb] = 0;
        local_4b8.data._M_elems[0xc] = 0;
        local_4b8.data._M_elems[0xd] = 0;
        local_4b8.data._M_elems[0xe] = 0;
        local_4b8.data._M_elems[0xf] = 0;
        local_4b8.data._M_elems[0x10] = 0;
        local_4b8.data._M_elems[0x11] = 0;
        local_4b8.data._M_elems[0x12] = 0;
        local_4b8.data._M_elems[0x13] = 0;
        local_4b8.data._M_elems[0x14] = 0;
        local_4b8.data._M_elems[0x15] = 0;
        local_4b8.data._M_elems[0x16] = 0;
        local_4b8.data._M_elems[0x17] = 0;
        local_4b8.data._M_elems[0x18] = 0;
        local_4b8.data._M_elems[0x19] = 0;
        local_4b8.data._M_elems._104_5_ = 0;
        local_4b8.data._M_elems[0x1b]._1_3_ = 0;
        local_4b8.exp = 0;
        local_4b8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_4b8,
                   &(this->theLRbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&local_538);
        local_3b8.fpclass = cpp_dec_float_finite;
        local_3b8.prec_elem = 0x1c;
        local_3b8.data._M_elems[0] = 0;
        local_3b8.data._M_elems[1] = 0;
        local_3b8.data._M_elems[2] = 0;
        local_3b8.data._M_elems[3] = 0;
        local_3b8.data._M_elems[4] = 0;
        local_3b8.data._M_elems[5] = 0;
        local_3b8.data._M_elems[6] = 0;
        local_3b8.data._M_elems[7] = 0;
        local_3b8.data._M_elems[8] = 0;
        local_3b8.data._M_elems[9] = 0;
        local_3b8.data._M_elems[10] = 0;
        local_3b8.data._M_elems[0xb] = 0;
        local_3b8.data._M_elems[0xc] = 0;
        local_3b8.data._M_elems[0xd] = 0;
        local_3b8.data._M_elems[0xe] = 0;
        local_3b8.data._M_elems[0xf] = 0;
        local_3b8.data._M_elems[0x10] = 0;
        local_3b8.data._M_elems[0x11] = 0;
        local_3b8.data._M_elems[0x12] = 0;
        local_3b8.data._M_elems[0x13] = 0;
        local_3b8.data._M_elems[0x14] = 0;
        local_3b8.data._M_elems[0x15] = 0;
        local_3b8.data._M_elems[0x16] = 0;
        local_3b8.data._M_elems[0x17] = 0;
        local_3b8.data._M_elems[0x18] = 0;
        local_3b8.data._M_elems[0x19] = 0;
        local_3b8.data._M_elems._104_5_ = 0;
        local_3b8.data._M_elems[0x1b]._1_3_ = 0;
        local_3b8.exp = 0;
        local_3b8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_3b8,
                   &(this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&oldLhs->m_backend);
        local_648.fpclass = cpp_dec_float_finite;
        local_648.prec_elem = 0x1c;
        local_648.data._M_elems[0] = 0;
        local_648.data._M_elems[1] = 0;
        local_648.data._M_elems[2] = 0;
        local_648.data._M_elems[3] = 0;
        local_648.data._M_elems[4] = 0;
        local_648.data._M_elems[5] = 0;
        local_648.data._M_elems[6] = 0;
        local_648.data._M_elems[7] = 0;
        local_648.data._M_elems[8] = 0;
        local_648.data._M_elems[9] = 0;
        local_648.data._M_elems[10] = 0;
        local_648.data._M_elems[0xb] = 0;
        local_648.data._M_elems[0xc] = 0;
        local_648.data._M_elems[0xd] = 0;
        local_648.data._M_elems[0xe] = 0;
        local_648.data._M_elems[0xf] = 0;
        local_648.data._M_elems[0x10] = 0;
        local_648.data._M_elems[0x11] = 0;
        local_648.data._M_elems[0x12] = 0;
        local_648.data._M_elems[0x13] = 0;
        local_648.data._M_elems[0x14] = 0;
        local_648.data._M_elems[0x15] = 0;
        local_648.data._M_elems[0x16] = 0;
        local_648.data._M_elems[0x17] = 0;
        local_648.data._M_elems[0x18] = 0;
        local_648.data._M_elems[0x19] = 0;
        local_648.data._M_elems._104_5_ = 0;
        local_648.data._M_elems[0x1b]._1_3_ = 0;
        local_648.exp = 0;
        local_648.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_648,&local_4b8,&local_3b8);
      }
      else {
        pSVar1[i] = P_FREE;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar2 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar2 + i;
        pcVar14 = &local_4b8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar14->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        local_4b8.exp = pnVar2[i].m_backend.exp;
        local_4b8.neg = pnVar2[i].m_backend.neg;
        local_4b8.fpclass = pnVar2[i].m_backend.fpclass;
        local_4b8.prec_elem = pnVar2[i].m_backend.prec_elem;
        if (local_4b8.fpclass != cpp_dec_float_finite || local_4b8.data._M_elems[0] != 0) {
          local_4b8.neg = (bool)(local_4b8.neg ^ 1);
        }
        local_648.fpclass = cpp_dec_float_finite;
        local_648.prec_elem = 0x1c;
        local_648.data._M_elems[0] = 0;
        local_648.data._M_elems[1] = 0;
        local_648.data._M_elems[2] = 0;
        local_648.data._M_elems[3] = 0;
        local_648.data._M_elems[4] = 0;
        local_648.data._M_elems[5] = 0;
        local_648.data._M_elems[6] = 0;
        local_648.data._M_elems[7] = 0;
        local_648.data._M_elems[8] = 0;
        local_648.data._M_elems[9] = 0;
        local_648.data._M_elems[10] = 0;
        local_648.data._M_elems[0xb] = 0;
        local_648.data._M_elems[0xc] = 0;
        local_648.data._M_elems[0xd] = 0;
        local_648.data._M_elems[0xe] = 0;
        local_648.data._M_elems[0xf] = 0;
        local_648.data._M_elems[0x10] = 0;
        local_648.data._M_elems[0x11] = 0;
        local_648.data._M_elems[0x12] = 0;
        local_648.data._M_elems[0x13] = 0;
        local_648.data._M_elems[0x14] = 0;
        local_648.data._M_elems[0x15] = 0;
        local_648.data._M_elems[0x16] = 0;
        local_648.data._M_elems[0x17] = 0;
        local_648.data._M_elems[0x18] = 0;
        local_648.data._M_elems[0x19] = 0;
        local_648.data._M_elems._104_5_ = 0;
        local_648.data._M_elems[0x1b]._1_3_ = 0;
        local_648.exp = 0;
        local_648.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_648,&local_4b8,&oldLhs->m_backend);
      }
      pcVar14 = &local_648;
      puVar11 = (uint *)&local_5b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar11 = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        puVar11 = puVar11 + (ulong)bVar18 * -2 + 1;
      }
      iStack_548 = local_648.exp;
      uStack_544 = local_648.neg;
    }
    goto LAB_004e9601;
  case P_ON_UPPER:
    pnVar12 = newLhs;
    pnVar16 = &local_130;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (newLhs->m_backend).exp;
    local_130.m_backend.neg = (newLhs->m_backend).neg;
    local_130.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_130.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    pcVar14 = &local_538;
    pnVar12 = &local_1b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_538.exp;
    local_1b0.m_backend.neg = local_538.neg;
    local_1b0.m_backend.fpclass = local_538.fpclass;
    local_1b0.m_backend.prec_elem = local_538.prec_elem;
    RVar3 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar5 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_130,&local_1b0,RVar3);
    if (bVar5) {
      pSVar1[i] = P_FIXED;
    }
    break;
  case P_FREE:
    ::soplex::infinity::__tls_init();
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 0x1c;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems[6] = 0;
    local_648.data._M_elems[7] = 0;
    local_648.data._M_elems[8] = 0;
    local_648.data._M_elems[9] = 0;
    local_648.data._M_elems[10] = 0;
    local_648.data._M_elems[0xb] = 0;
    local_648.data._M_elems[0xc] = 0;
    local_648.data._M_elems[0xd] = 0;
    local_648.data._M_elems[0xe] = 0;
    local_648.data._M_elems[0xf] = 0;
    local_648.data._M_elems[0x10] = 0;
    local_648.data._M_elems[0x11] = 0;
    local_648.data._M_elems[0x12] = 0;
    local_648.data._M_elems[0x13] = 0;
    local_648.data._M_elems[0x14] = 0;
    local_648.data._M_elems[0x15] = 0;
    local_648.data._M_elems[0x16] = 0;
    local_648.data._M_elems[0x17] = 0;
    local_648.data._M_elems[0x18] = 0;
    local_648.data._M_elems[0x19] = 0;
    local_648.data._M_elems._104_5_ = 0;
    local_648.data._M_elems[0x1b]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_648,-*(double *)(in_FS_OFFSET + -8));
    if (((((newLhs->m_backend).fpclass == cpp_dec_float_NaN) ||
         (local_648.fpclass == cpp_dec_float_NaN)) ||
        (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&newLhs->m_backend,&local_648), iVar6 < 1)) ||
       ((pSVar1[i] = P_ON_LOWER, this->m_nonbasicValueUpToDate != true || (this->theRep != COLUMN)))
       ) break;
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 0x1c;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems[6] = 0;
    local_648.data._M_elems[7] = 0;
    local_648.data._M_elems[8] = 0;
    local_648.data._M_elems[9] = 0;
    local_648.data._M_elems[10] = 0;
    local_648.data._M_elems[0xb] = 0;
    local_648.data._M_elems[0xc] = 0;
    local_648.data._M_elems[0xd] = 0;
    local_648.data._M_elems[0xe] = 0;
    local_648.data._M_elems[0xf] = 0;
    local_648.data._M_elems[0x10] = 0;
    local_648.data._M_elems[0x11] = 0;
    local_648.data._M_elems[0x12] = 0;
    local_648.data._M_elems[0x13] = 0;
    local_648.data._M_elems[0x14] = 0;
    local_648.data._M_elems[0x15] = 0;
    local_648.data._M_elems[0x16] = 0;
    local_648.data._M_elems[0x17] = 0;
    local_648.data._M_elems[0x18] = 0;
    local_648.data._M_elems[0x19] = 0;
    local_648.data._M_elems._104_5_ = 0;
    local_648.data._M_elems[0x1b]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_648,
               &(this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newLhs->m_backend);
    pcVar14 = &local_648;
    puVar11 = (uint *)&local_5b8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar11 = (pcVar14->data)._M_elems[0];
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
      puVar11 = puVar11 + (ulong)bVar18 * -2 + 1;
    }
    iStack_548 = local_648.exp;
    uStack_544 = local_648.neg;
LAB_004e9601:
    local_540._0_4_ = local_648.fpclass;
    local_540._4_4_ = local_648.prec_elem;
    local_648.exp = iStack_548;
    local_648.neg = (bool)uStack_544;
  }
  if (this->theRep == COLUMN) {
    puVar11 = (uint *)&local_5b8;
    pnVar12 = &local_330;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = *puVar11;
      puVar11 = puVar11 + (ulong)bVar18 * -2 + 1;
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = iStack_548;
    local_330.m_backend.neg = (bool)uStack_544;
    local_330.m_backend.fpclass = (fpclass_type)local_540;
    local_330.m_backend.prec_elem = local_540._4_4_;
    updateNonbasicValue(this,&local_330);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhsStatus(int i, R newLhs, R oldLhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currRhs   = this->rhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG03 changeLhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(newLhs <= R(-infinity))
      {
         if(currRhs >= R(infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theURbound[i] * oldLhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theLRbound[i] * currRhs) - (theURbound[i] * oldLhs);
         }
      }
      else if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newLhs - oldLhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theURbound[i] * (newLhs - oldLhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newLhs > R(-infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theURbound[i] * newLhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(isInitialized())
            theLRbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG03 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}